

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void print_name(flatcc_json_printer_t *ctx,char *name,size_t len)

{
  char *pcVar1;
  size_t len_local;
  char *name_local;
  flatcc_json_printer_t *ctx_local;
  
  if (ctx->indent == '\0') {
    flatcc_json_printer_flush_partial(ctx);
  }
  else {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\n';
    print_indent(ctx);
  }
  print_symbol(ctx,name,len);
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = ':';
  *ctx->p = ' ';
  ctx->p = ctx->p + (int)(uint)(ctx->indent != '\0');
  return;
}

Assistant:

static inline void print_name(flatcc_json_printer_t *ctx, const char *name, size_t len)
{
    print_nl();
    print_symbol(ctx, name, len);
    print_char(':');
    print_space();
}